

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

either * toml::detail::syntax::time_offset(either *__return_storage_ptr__,spec *s)

{
  initializer_list<unsigned_char> cs;
  initializer_list<unsigned_char> cs_00;
  uchar local_f4 [4];
  character local_f0;
  repeat_exact local_e0;
  repeat_exact local_c8;
  character_either local_b0;
  sequence local_90;
  character_either local_70;
  digit local_50;
  digit local_38;
  
  local_f4[2] = 'Z';
  local_f4[3] = 'z';
  cs._M_len = 2;
  cs._M_array = local_f4 + 2;
  character_either::character_either(&local_70,cs);
  local_f4[0] = '+';
  local_f4[1] = '-';
  cs_00._M_len = 2;
  cs_00._M_array = local_f4;
  character_either::character_either(&local_b0,cs_00);
  local_38.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004e97f0;
  local_38.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_004e89c0;
  local_38.scanner_.from_ = '0';
  local_38.scanner_.to_ = '9';
  repeat_exact::repeat_exact<toml::detail::syntax::digit>(&local_c8,2,&local_38);
  local_f0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004e8900;
  local_f0.value_ = ':';
  local_50.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004e97f0;
  local_50.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_004e89c0;
  local_50.scanner_.from_ = '0';
  local_50.scanner_.to_ = '9';
  repeat_exact::repeat_exact<toml::detail::syntax::digit>(&local_e0,2,&local_50);
  sequence::
  sequence<toml::detail::character_either,toml::detail::repeat_exact,toml::detail::character,toml::detail::repeat_exact>
            (&local_90,&local_b0,&local_c8,&local_f0,&local_e0);
  either::either<toml::detail::character_either,toml::detail::sequence>
            (__return_storage_ptr__,&local_70,&local_90);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_90.others_);
  if (local_e0.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_e0.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  if ((__uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      )local_c8.other_.scanner_._M_t.
       super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
       ._M_t.
       super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
       .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      )0x0) {
    (*(*(_func_int ***)
        local_c8.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  CLI::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b0.chars_);
  CLI::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70.chars_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE either time_offset(const spec& s)
{
    return either(
            character_either{'Z', 'z'},
            sequence(character_either{'+', '-'},
                     repeat_exact(2, digit(s)),
                     character(':'),
                     repeat_exact(2, digit(s))
             )
        );
}